

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms917.cpp
# Opt level: O0

complex<double> wrightomega(complex<double> z)

{
  complex<double> z_00;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  complex<double> *in_R8;
  complex<double> *in_R9;
  complex<double> cVar1;
  undefined1 local_58 [8];
  complex<double> r;
  complex<double> e;
  complex<double> cond;
  complex<double> z_local;
  complex<double> w;
  
  std::complex<double>::complex((complex<double> *)(e._M_value + 8),0.0,0.0);
  std::complex<double>::complex((complex<double> *)(r._M_value + 8),0.0,0.0);
  std::complex<double>::complex((complex<double> *)local_58,0.0,0.0);
  std::complex<double>::complex((complex<double> *)(z_local._M_value + 8),0.0,0.0);
  z_00._M_value._8_8_ = (complex<double> *)(r._M_value + 8);
  z_00._M_value._0_8_ = (complex<double> *)(z_local._M_value + 8);
  cVar1._M_value._0_4_ =
       wrightomega_ext(z_00,(complex<double> *)local_58,(complex<double> *)(e._M_value + 8),in_R8,
                       in_R9);
  cVar1._M_value._4_4_ = extraout_var;
  cVar1._M_value._8_8_ = extraout_RDX;
  return (complex<double>)cVar1._M_value;
}

Assistant:

std::complex <double> wrightomega ( std::complex <double> z )

//****************************************************************************80
//
//  Purpose:
//
//    WRIGHTOMEGA is the simple routine for evaluating the Wright Omega function. 
//
//  Discussion:
//
//    This function is called by:
//
//      w = wrightomega ( z )
//
//    This function makes a call to the more powerful wrightomega_ext() function.
//
//  Modified:
//
//    14 May 2016
//
//  Author:
//
//    Piers Lawrence, Robert Corless, David Jeffrey
//
//  Reference:
//
//    Piers Lawrence, Robert Corless, David Jeffrey,
//    Algorithm 917: Complex Double-Precision Evaluation of the Wright Omega 
//    Function,
//    ACM Transactions on Mathematical Software,
//    Volume 38, Number 3, Article 20, April 2012, 17 pages.
//
//  Parameters:
//
//    Input, complex <double> Z, the argument.
//
//    Output, complex <double> WRIGHTOMEGA, the value of the Wright Omega
//    function of Z.
//
{
  std::complex <double> cond;
  std::complex <double> e;
  std::complex <double> r;
  std::complex <double> w;

  wrightomega_ext ( z, w, e, r, cond );

  return w;
}